

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O3

bool __thiscall Am_Font_Data::Get_Font(Am_Font_Data *this,Display *dpy,XFontStruct **xfont)

{
  Font_Index *pFVar1;
  
  pFVar1 = this->font_head;
  while( true ) {
    if (pFVar1 == (Font_Index *)0x0) {
      return false;
    }
    if (pFVar1->dpy == dpy) break;
    pFVar1 = pFVar1->next;
  }
  *xfont = pFVar1->xfont;
  return true;
}

Assistant:

bool
Am_Font_Data::Get_Font(Display *dpy, XFontStruct *&xfont)
{
  Font_Index *current;
  for (current = font_head; current != nullptr; current = current->next)
    if (current->dpy == dpy) {
      xfont = current->xfont;
      return true;
    }
  return false;
}